

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

StringRef __thiscall llvm::ARM::computeDefaultTargetABI(ARM *this,Triple *TT,StringRef CPU)

{
  int iVar1;
  ArchKind AVar2;
  ProfileKind PVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  StringRef SVar7;
  StringRef SVar8;
  
  SVar7.Length = CPU.Data;
  if (SVar7.Length == (char *)0x0) {
    SVar7 = Triple::getArchName((Triple *)this);
  }
  else {
    SVar7.Data = SVar7.Length;
    AVar2 = parseCPUArch((ARM *)TT,SVar7);
    SVar7 = *(StringRef *)(&(anonymous_namespace)::ARCHNames + (ulong)AVar2 * 8);
  }
  if (*(int *)(this + 0x34) == 3) {
    sVar5 = 5;
    pcVar6 = "aapcs";
    if ((*(int *)(this + 0x30) != 8) && (*(int *)(this + 0x2c) != 0)) {
      PVar3 = parseArchProfile(SVar7);
      if (PVar3 != M) {
        pcVar6 = "apcs-gnu";
        if (*(int *)(this + 0x24) == 0xd) {
          pcVar6 = "aapcs16";
        }
        sVar5 = (ulong)(*(int *)(this + 0x24) != 0xd) + 7;
      }
    }
  }
  else {
    iVar1 = *(int *)(this + 0x2c);
    sVar5 = 5;
    pcVar6 = "aapcs";
    if (iVar1 != 0xf) {
      uVar4 = *(int *)(this + 0x30) - 4;
      if ((uVar4 < 10) && ((0x373U >> (uVar4 & 0x1f) & 1) != 0)) {
        pcVar6 = &DAT_001d31b0 + *(int *)(&DAT_001d31b0 + (ulong)uVar4 * 4);
        sVar5 = *(size_t *)(&DAT_001d31d8 + (ulong)uVar4 * 8);
      }
      else if (iVar1 == 0xc) {
        sVar5 = 8;
        pcVar6 = "apcs-gnu";
      }
      else if (iVar1 == 0xd) {
        sVar5 = 0xb;
        pcVar6 = "aapcs-linux";
      }
    }
  }
  SVar8.Length = sVar5;
  SVar8.Data = pcVar6;
  return SVar8;
}

Assistant:

StringRef llvm::ARM::computeDefaultTargetABI(const Triple &TT, StringRef CPU) {
  StringRef ArchName =
      CPU.empty() ? TT.getArchName() : ARM::getArchName(ARM::parseCPUArch(CPU));

  if (TT.isOSBinFormatMachO()) {
    if (TT.getEnvironment() == Triple::EABI ||
        TT.getOS() == Triple::UnknownOS ||
        llvm::ARM::parseArchProfile(ArchName) == ARM::ProfileKind::M)
      return "aapcs";
    if (TT.isWatchABI())
      return "aapcs16";
    return "apcs-gnu";
  } else if (TT.isOSWindows())
    // FIXME: this is invalid for WindowsCE.
    return "aapcs";

  // Select the default based on the platform.
  switch (TT.getEnvironment()) {
  case Triple::Android:
  case Triple::GNUEABI:
  case Triple::GNUEABIHF:
  case Triple::MuslEABI:
  case Triple::MuslEABIHF:
    return "aapcs-linux";
  case Triple::EABIHF:
  case Triple::EABI:
    return "aapcs";
  default:
    if (TT.isOSNetBSD())
      return "apcs-gnu";
    if (TT.isOSOpenBSD())
      return "aapcs-linux";
    return "aapcs";
  }
}